

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

vector<std::shared_ptr<TgBot::ChatMember>,_std::allocator<std::shared_ptr<TgBot::ChatMember>_>_> *
__thiscall
TgBot::Api::getChatAdministrators
          (vector<std::shared_ptr<TgBot::ChatMember>,_std::allocator<std::shared_ptr<TgBot::ChatMember>_>_>
           *__return_storage_ptr__,Api *this,int64_t chatId)

{
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  int64_t local_80;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_78;
  string local_60;
  ptree local_40;
  
  local_78.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = chatId;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&local_78,1);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_78,
             (char (*) [8])0x2600ca,&local_80);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"getChatAdministrators","");
  sendRequest(&local_40,this,&local_60,&local_78);
  TgTypeParser::parseJsonAndGetArray<TgBot::ChatMember>
            (__return_storage_ptr__,(TgTypeParser *)&this->field_0x28,0x1c2698,(ptree *)0x0);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

vector<ChatMember::Ptr> Api::getChatAdministrators(int64_t chatId) const {
    vector<HttpReqArg> args;
    args.reserve(1);
    args.emplace_back("chat_id", chatId);
    return _tgTypeParser.parseJsonAndGetArray<ChatMember>(&TgTypeParser::parseJsonAndGetChatMember, sendRequest("getChatAdministrators", args));
}